

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

string * OpToTex_abi_cxx11_(string *__return_storage_ptr__,int op)

{
  char *__s;
  allocator<char> local_9;
  
  switch(op) {
  case 1:
    __s = "+";
    break;
  case 2:
    __s = "-";
    break;
  case 3:
    __s = "\\cdot ";
    break;
  case 4:
    __s = "\\frac ";
    break;
  case 5:
    __s = "^";
    break;
  case 6:
    __s = "\\exp ";
    break;
  case 7:
    __s = "\\log ";
    break;
  case 8:
    __s = "\\sqrt ";
    break;
  case 9:
    __s = "\\sin ";
    break;
  case 10:
    __s = "\\cos ";
    break;
  case 0xb:
    __s = "\\tan ";
    break;
  case 0xc:
    __s = "\\cot ";
    break;
  case 0xd:
    __s = "\\arcsin ";
    break;
  case 0xe:
    __s = "\\arccos ";
    break;
  case 0xf:
    __s = "\\arctan ";
    break;
  case 0x10:
    __s = "\\arccot ";
    break;
  default:
    __s = "nil";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string OpToTex(int op)
{
    switch (op) {
    case ADD:
        return "+";
    case SUB:
        return "-";
    case MUL:
        return "\\cdot ";
    case DIV:
        return "\\frac ";
    case COS:
        return "\\cos ";
    case SIN:
        return "\\sin ";
    case TAN:
        return "\\tan ";
    case COT:
        return "\\cot ";
    case EXP:
        return "\\exp ";
    case PWR:
        return "^";
    case LOG:
        return "\\log ";
    case SQRT:
        return "\\sqrt ";
    case ASIN:
        return "\\arcsin ";
    case ACOS:
        return "\\arccos ";
    case ATAN:
        return "\\arctan ";
    case ACOT:
        return "\\arccot ";
    default:
        return "nil";
    }
}